

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O3

bool duckdb::CSVCast::TryCastFloatingVectorCommaSeparated
               (CSVReaderOptions *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,LogicalType *result_type,idx_t *line_error)

{
  InternalException *this;
  idx_t row;
  undefined1 local_49;
  undefined8 local_48;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)parameters;
  if (result_type->physical_type_ == FLOAT) {
    local_40.field_2._8_8_ = &local_49;
    local_49 = 1;
    local_40.field_2._M_allocated_capacity = (size_type)&local_48;
    local_48 = 0;
    local_40._M_string_length = (size_type)line_error;
    UnaryExecutor::
    ExecuteStandard<duckdb::string_t,float,duckdb::UnaryLambdaWrapper,duckdb::CSVCast::TemplatedTryCastFloatingVector<duckdb::TryCastErrorMessageCommaSeparated,float>(duckdb::CSVReaderOptions_const&,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&,unsigned_long&)::_lambda(duckdb::string_t)_1_>
              (input_vector,result_vector,count,&local_40,false,CAN_THROW_RUNTIME_ERROR);
  }
  else {
    if (result_type->physical_type_ != DOUBLE) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unimplemented physical type for floating","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_40.field_2._8_8_ = &local_49;
    local_49 = 1;
    local_40.field_2._M_allocated_capacity = (size_type)&local_48;
    local_48 = 0;
    local_40._M_string_length = (size_type)line_error;
    UnaryExecutor::
    ExecuteStandard<duckdb::string_t,double,duckdb::UnaryLambdaWrapper,duckdb::CSVCast::TemplatedTryCastFloatingVector<duckdb::TryCastErrorMessageCommaSeparated,double>(duckdb::CSVReaderOptions_const&,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&,unsigned_long&)::_lambda(duckdb::string_t)_1_>
              (input_vector,result_vector,count,&local_40,false,CAN_THROW_RUNTIME_ERROR);
  }
  return (bool)local_49;
}

Assistant:

static bool TryCastFloatingVectorCommaSeparated(const CSVReaderOptions &options, Vector &input_vector,
	                                                Vector &result_vector, idx_t count, CastParameters &parameters,
	                                                const LogicalType &result_type, idx_t &line_error) {
		switch (result_type.InternalType()) {
		case PhysicalType::DOUBLE:
			return TemplatedTryCastFloatingVector<TryCastErrorMessageCommaSeparated, double>(
			    options, input_vector, result_vector, count, parameters, line_error);
		case PhysicalType::FLOAT:
			return TemplatedTryCastFloatingVector<TryCastErrorMessageCommaSeparated, float>(
			    options, input_vector, result_vector, count, parameters, line_error);
		default:
			throw InternalException("Unimplemented physical type for floating");
		}
	}